

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcSymProp * __thiscall
CTcParser::def_special_prop(CTcParser *this,int def,char *name,tc_prop_id *idp)

{
  tctarg_prop_id_t tVar1;
  int iVar2;
  CTcSymPropBase *this_00;
  size_t sVar3;
  undefined4 extraout_var;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar4;
  
  if (def == 0) {
    pCVar4 = this->global_symtab_;
    sVar3 = strlen(name);
    do {
      iVar2 = (*pCVar4->_vptr_CTcPrsSymtab[2])(pCVar4,name,sVar3);
      this_00 = (CTcSymPropBase *)CONCAT44(extraout_var,iVar2);
      if (this_00 != (CTcSymPropBase *)0x0) goto LAB_001fb055;
      pCVar4 = pCVar4->parent_;
    } while (pCVar4 != (CTcPrsSymtab *)0x0);
    this_00 = (CTcSymPropBase *)0x0;
LAB_001fb055:
    if ((this_00 == (CTcSymPropBase *)0x0) ||
       ((*(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
          _vptr_CVmHashEntry[0xf])(this_00),
       *(int *)&(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                super_CVmHashEntry.field_0x24 != 3)) {
      this_00 = (CTcSymPropBase *)CTcPrsMem::alloc(G_prsmem,0x30);
      sVar3 = strlen(name);
      CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,name,sVar3,0);
      *(undefined4 *)
       &(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
        field_0x24 = 3;
      this_00->prop_ = 0;
      this_00->field_0x2a = this_00->field_0x2a & 0xf8;
      (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
      _vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003209a0;
    }
  }
  else {
    tVar1 = (tctarg_prop_id_t)*(undefined4 *)&G_cg->next_prop_;
    G_cg->next_prop_ = tVar1 + 1;
    this_00 = (CTcSymPropBase *)CTcPrsMem::alloc(G_prsmem,0x30);
    sVar3 = strlen(name);
    CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,name,sVar3,0);
    *(undefined4 *)
     &(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
      field_0x24 = 3;
    this_00->prop_ = tVar1;
    this_00->field_0x2a = this_00->field_0x2a & 0xf8;
    (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
    _vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003209a0;
    CTcSymPropBase::mark_referenced(this_00);
    (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
  }
  if (idp != (tc_prop_id *)0x0) {
    *idp = (uint)this_00->prop_;
  }
  return (CTcSymProp *)this_00;
}

Assistant:

CTcSymProp *CTcParser::def_special_prop(int def, const char *name,
                                        tc_prop_id *idp)
{
    /* we haven't created or found the property yet */
    CTcSymProp *propsym = 0;
    
    /* define or look up the property, as required */
    if (def)
    {
        /* allocate the ID */
        tctarg_prop_id_t id = G_cg->new_prop_id();

        /* create the symbol */
        propsym = new CTcSymProp(name, strlen(name), FALSE, id);
        
        /* mark it as referenced, since the compiler itself uses it */
        propsym->mark_referenced();

        /* add it to the global symbol table */
        global_symtab_->add_entry(propsym);
    }
    else
    {
        /* find the entry */
        CTcSymbol *sym = global_symtab_->find(name, strlen(name));

        /* check to see if we found a property symbol */
        if (sym != 0 && sym->get_type() == TC_SYM_PROP)
        {
            /* got it - use the definition we found */
            propsym = (CTcSymProp *)sym;
        }
        else
        {
            /* not found - create a dummy symbol for it */
            propsym = new CTcSymProp(name, strlen(name), FALSE,
                                     TCTARG_INVALID_PROP);
        }
    }

    /* hand the property ID back to the caller if they want it */
    if (idp != 0)
        *idp = (propsym != 0 ? propsym->get_prop() : TCTARG_INVALID_PROP);

    /* return the symbol */
    return propsym;
}